

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall
cppcms::impl::cgi::connection::cgi_forwarder::on_post_data_read
          (cgi_forwarder *this,error_code *e,size_t len)

{
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> iStack_98;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_90;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_88 [8]
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  const_buffer local_78;
  mutable_buffer local_48;
  
  if (e->_M_value != 0) {
    cleanup(this,(EVP_PKEY_CTX *)e);
    return;
  }
  (*((this->conn_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_connection[0x12])();
  booster::aio::buffer
            (&local_48,
             (this->post_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,len);
  booster::aio::const_buffer::const_buffer(&local_78,&local_48);
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_88,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&iStack_98,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_post_data_written);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  intrusive_ptr(&local_90,&iStack_98);
  booster::aio::stream_socket::async_write((const_buffer *)&this->scgi_,(callback *)&local_78);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_90);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&iStack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&local_78.super_buffer_impl<const_char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_48.super_buffer_impl<char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return;
}

Assistant:

void on_post_data_read(booster::system::error_code const &e,size_t len)
		{
			if(e)  { cleanup(); return; }
			conn_->on_async_read_complete();
			scgi_.async_write(
				booster::aio::buffer(&post_.front(),len),
				mfunc_to_io_handler(&cgi_forwarder::on_post_data_written,shared_from_this()));
		}